

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O2

void __thiscall
Js::ProbeContainer::RegisterContextToDiag
          (ProbeContainer *this,DWORD_PTR context,ArenaAllocator *alloc)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  List<unsigned_long,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_00
  ;
  DWORD_PTR local_28;
  DWORD_PTR context_local;
  
  local_28 = context;
  bVar2 = ScriptContext::IsScriptContextInSourceRundownOrDebugMode(this->pScriptContext);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
                                ,0x3d0,
                                "(this->pScriptContext->IsScriptContextInSourceRundownOrDebugMode())"
                                ,"this->pScriptContext->IsScriptContextInSourceRundownOrDebugMode()"
                               );
    if (!bVar2) goto LAB_007fe8a7;
    *puVar3 = 0;
  }
  if (alloc == (ArenaAllocator *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
                                ,0x3d1,"(alloc)","alloc");
    if (!bVar2) {
LAB_007fe8a7:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this_00 = this->registeredFuncContextList;
  if (this_00 ==
      (List<unsigned_long,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
      0x0) {
    this_00 = JsUtil::
              List<unsigned_long,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::New(alloc,4);
    this->registeredFuncContextList = this_00;
  }
  JsUtil::List<unsigned_long,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::Add(this_00,&local_28);
  return;
}

Assistant:

void ProbeContainer::RegisterContextToDiag(DWORD_PTR context, ArenaAllocator *alloc)
    {
        Assert(this->pScriptContext->IsScriptContextInSourceRundownOrDebugMode());
        Assert(alloc);

        if (registeredFuncContextList == nullptr)
        {
            registeredFuncContextList = JsUtil::List<DWORD_PTR, ArenaAllocator>::New(alloc);
        }

        registeredFuncContextList->Add(context);
    }